

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw.c
# Opt level: O3

int raw_exitcode(Backend *be)

{
  int iVar1;
  
  if (be[-5].vt != (BackendVtable *)0x0) {
    return -1;
  }
  iVar1 = 0x7fffffff;
  if (*(char *)&be[-5].interactor == '\0') {
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int raw_exitcode(Backend *be)
{
    Raw *raw = container_of(be, Raw, backend);
    if (raw->s != NULL)
        return -1;                     /* still connected */
    else if (raw->closed_on_socket_error)
        return INT_MAX;     /* a socket error counts as an unclean exit */
    else
        /* Exit codes are a meaningless concept in the Raw protocol */
        return 0;
}